

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlEntityPtr xmlParseEntityRef(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  xmlEntityType xVar2;
  getEntitySAXFunc p_Var3;
  referenceSAXFunc p_Var4;
  int iVar5;
  xmlChar *name;
  xmlEntityPtr pxVar6;
  xmlChar *pxVar7;
  char *msg;
  xmlParserErrors error;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->instate == XML_PARSER_EOF) {
    return (xmlEntityPtr)0x0;
  }
  if (*ctxt->input->cur != '&') {
    return (xmlEntityPtr)0x0;
  }
  xmlNextChar(ctxt);
  name = xmlParseName(ctxt);
  if (name == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseEntityRef: no name\n");
    return (xmlEntityPtr)0x0;
  }
  if (*ctxt->input->cur != ';') {
    xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
    return (xmlEntityPtr)0x0;
  }
  xmlNextChar(ctxt);
  if (((ctxt->options & 0x100000) == 0) &&
     (pxVar6 = xmlGetPredefinedEntity(name), pxVar6 != (xmlEntityPtr)0x0)) {
    return pxVar6;
  }
  ctxt->nbentities = ctxt->nbentities + 1;
  if (ctxt->sax != (_xmlSAXHandler *)0x0) {
    p_Var3 = ctxt->sax->getEntity;
    if (p_Var3 == (getEntitySAXFunc)0x0) {
      pxVar6 = (xmlEntityPtr)0x0;
    }
    else {
      pxVar6 = (*p_Var3)(ctxt->userData,name);
    }
    iVar5 = ctxt->wellFormed;
    if ((iVar5 == 1) && (pxVar6 == (xmlEntityPtr)0x0)) {
      if ((ctxt->options & 0x100000) == 0) {
        iVar5 = 1;
        pxVar6 = (xmlEntityPtr)0x0;
      }
      else {
        pxVar6 = xmlGetPredefinedEntity(name);
        iVar5 = ctxt->wellFormed;
      }
    }
    if ((iVar5 != 1) || (pxVar6 != (xmlEntityPtr)0x0)) goto LAB_00164519;
    if ((xmlParserCtxtPtr)ctxt->userData == ctxt) {
      pxVar6 = xmlSAX2GetEntity(ctxt,name);
      goto LAB_00164519;
    }
  }
  pxVar6 = (xmlEntityPtr)0x0;
LAB_00164519:
  xVar1 = ctxt->instate;
  if (xVar1 == XML_PARSER_EOF) {
    return (xmlEntityPtr)0x0;
  }
  if (pxVar6 == (xmlEntityPtr)0x0) {
    if ((ctxt->standalone == 1) || ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
      xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",name);
    }
    else {
      xmlErrMsgStr(ctxt,XML_WAR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",name);
      if (((ctxt->inSubset == 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
         (p_Var4 = ctxt->sax->reference, p_Var4 != (referenceSAXFunc)0x0)) {
        (*p_Var4)(ctxt->userData,name);
      }
    }
    xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
    ctxt->valid = 0;
    return (xmlEntityPtr)0x0;
  }
  xVar2 = pxVar6->etype;
  if (xVar2 == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
    msg = "Entity reference to unparsed entity %s\n";
    error = XML_ERR_UNPARSED_ENTITY;
  }
  else if ((xVar1 == XML_PARSER_ATTRIBUTE_VALUE) && (xVar2 == XML_EXTERNAL_GENERAL_PARSED_ENTITY)) {
    msg = "Attribute references external entity \'%s\'\n";
    error = XML_ERR_ENTITY_IS_EXTERNAL;
  }
  else if (xVar1 == XML_PARSER_ATTRIBUTE_VALUE) {
    if (xVar2 == XML_INTERNAL_PREDEFINED_ENTITY) {
      return pxVar6;
    }
    if (pxVar6->checked != 0 && (pxVar6->checked & 1U) == 0) {
      return pxVar6;
    }
    if (pxVar6->content == (xmlChar *)0x0) {
      return pxVar6;
    }
    pxVar7 = xmlStrchr(pxVar6->content,'<');
    if (pxVar7 == (xmlChar *)0x0) {
      return pxVar6;
    }
    msg = "\'<\' in entity \'%s\' is not allowed in attributes values\n";
    error = XML_ERR_LT_IN_ATTRIBUTE;
  }
  else {
    if ((xVar2 & ~XML_INTERNAL_GENERAL_ENTITY) != XML_INTERNAL_PARAMETER_ENTITY) {
      return pxVar6;
    }
    msg = "Attempt to reference the parameter entity \'%s\'\n";
    error = XML_ERR_ENTITY_IS_PARAMETER;
  }
  xmlFatalErrMsgStr(ctxt,error,msg,name);
  return pxVar6;
}

Assistant:

xmlEntityPtr
xmlParseEntityRef(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlEntityPtr ent = NULL;

    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        return(NULL);

    if (RAW != '&')
        return(NULL);
    NEXT;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseEntityRef: no name\n");
        return(NULL);
    }
    if (RAW != ';') {
	xmlFatalErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING, NULL);
	return(NULL);
    }
    NEXT;

    /*
     * Predefined entities override any extra definition
     */
    if ((ctxt->options & XML_PARSE_OLDSAX) == 0) {
        ent = xmlGetPredefinedEntity(name);
        if (ent != NULL)
            return(ent);
    }

    /*
     * Increase the number of entity references parsed
     */
    ctxt->nbentities++;

    /*
     * Ask first SAX for entity resolution, otherwise try the
     * entities which may have stored in the parser context.
     */
    if (ctxt->sax != NULL) {
	if (ctxt->sax->getEntity != NULL)
	    ent = ctxt->sax->getEntity(ctxt->userData, name);
	if ((ctxt->wellFormed == 1 ) && (ent == NULL) &&
	    (ctxt->options & XML_PARSE_OLDSAX))
	    ent = xmlGetPredefinedEntity(name);
	if ((ctxt->wellFormed == 1 ) && (ent == NULL) &&
	    (ctxt->userData==ctxt)) {
	    ent = xmlSAX2GetEntity(ctxt, name);
	}
    }
    if (ctxt->instate == XML_PARSER_EOF)
	return(NULL);
    /*
     * [ WFC: Entity Declared ]
     * In a document without any DTD, a document with only an
     * internal DTD subset which contains no parameter entity
     * references, or a document with "standalone='yes'", the
     * Name given in the entity reference must match that in an
     * entity declaration, except that well-formed documents
     * need not declare any of the following entities: amp, lt,
     * gt, apos, quot.
     * The declaration of a parameter entity must precede any
     * reference to it.
     * Similarly, the declaration of a general entity must
     * precede any reference to it which appears in a default
     * value in an attribute-list declaration. Note that if
     * entities are declared in the external subset or in
     * external parameter entities, a non-validating processor
     * is not obligated to read and process their declarations;
     * for such documents, the rule that an entity must be
     * declared is a well-formedness constraint only if
     * standalone='yes'.
     */
    if (ent == NULL) {
	if ((ctxt->standalone == 1) ||
	    ((ctxt->hasExternalSubset == 0) &&
	     (ctxt->hasPErefs == 0))) {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNDECLARED_ENTITY,
		     "Entity '%s' not defined\n", name);
	} else {
	    xmlErrMsgStr(ctxt, XML_WAR_UNDECLARED_ENTITY,
		     "Entity '%s' not defined\n", name);
	    if ((ctxt->inSubset == 0) &&
		(ctxt->sax != NULL) &&
		(ctxt->sax->reference != NULL)) {
		ctxt->sax->reference(ctxt->userData, name);
	    }
	}
	xmlParserEntityCheck(ctxt, 0, ent, 0);
	ctxt->valid = 0;
    }

    /*
     * [ WFC: Parsed Entity ]
     * An entity reference must not contain the name of an
     * unparsed entity
     */
    else if (ent->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_UNPARSED_ENTITY,
		 "Entity reference to unparsed entity %s\n", name);
    }

    /*
     * [ WFC: No External Entity References ]
     * Attribute values cannot contain direct or indirect
     * entity references to external entities.
     */
    else if ((ctxt->instate == XML_PARSER_ATTRIBUTE_VALUE) &&
	     (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY)) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_IS_EXTERNAL,
	     "Attribute references external entity '%s'\n", name);
    }
    /*
     * [ WFC: No < in Attribute Values ]
     * The replacement text of any entity referred to directly or
     * indirectly in an attribute value (other than "&lt;") must
     * not contain a <.
     */
    else if ((ctxt->instate == XML_PARSER_ATTRIBUTE_VALUE) &&
	     (ent != NULL) &&
	     (ent->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
	if (((ent->checked & 1) || (ent->checked == 0)) &&
	     (ent->content != NULL) && (xmlStrchr(ent->content, '<'))) {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_LT_IN_ATTRIBUTE,
	"'<' in entity '%s' is not allowed in attributes values\n", name);
        }
    }

    /*
     * Internal check, no parameter entities here ...
     */
    else {
	switch (ent->etype) {
	    case XML_INTERNAL_PARAMETER_ENTITY:
	    case XML_EXTERNAL_PARAMETER_ENTITY:
	    xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_IS_PARAMETER,
	     "Attempt to reference the parameter entity '%s'\n",
			      name);
	    break;
	    default:
	    break;
	}
    }

    /*
     * [ WFC: No Recursion ]
     * A parsed entity must not contain a recursive reference
     * to itself, either directly or indirectly.
     * Done somewhere else
     */
    return(ent);
}